

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

void * dlrealloc_in_place(void *oldmem,size_t bytes)

{
  int *piVar1;
  mstate pmVar2;
  void *pvVar3;
  int in_ECX;
  size_t in_RDX;
  size_t extraout_RDX;
  mchunkptr p;
  bool bVar4;
  
  if (oldmem != (void *)0x0) {
    if (bytes < 0xffffffffffffff80) {
      p = (mchunkptr)&DAT_00000020;
      if (0x16 < bytes) {
        p = (mchunkptr)(bytes + 0x17 & 0xfffffffffffffff0);
      }
      if (((byte)_gm_.mflags & 2) != 0) {
        LOCK();
        UNLOCK();
        bVar4 = _gm_.mutex != 0;
        _gm_.mutex = 1;
        if (bVar4) {
          spin_acquire_lock(&_gm_.mutex);
          in_RDX = extraout_RDX;
        }
      }
      pmVar2 = (mstate)try_realloc_chunk((mstate)((long)oldmem + -0x10),p,in_RDX,in_ECX);
      if (((byte)_gm_.mflags & 2) != 0) {
        _gm_.mutex = 0;
      }
      pvVar3 = (void *)0x0;
      if (pmVar2 == (mstate)((long)oldmem + -0x10)) {
        pvVar3 = oldmem;
      }
    }
    else {
      piVar1 = _PDCLIB_errno_func();
      *piVar1 = 0xc;
      pvVar3 = (void *)0x0;
    }
    return pvVar3;
  }
  return (void *)0x0;
}

Assistant:

void* dlrealloc_in_place(void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem != 0) {
    if (bytes >= MAX_REQUEST) {
      MALLOC_FAILURE_ACTION;
    }
    else {
      size_t nb = request2size(bytes);
      mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
      mstate m = gm;
#else /* FOOTERS */
      mstate m = get_mstate_for(oldp);
      if (!ok_magic(m)) {
        USAGE_ERROR_ACTION(m, oldmem);
        return 0;
      }
#endif /* FOOTERS */
      if (!PREACTION(m)) {
        mchunkptr newp = try_realloc_chunk(m, oldp, nb, 0);
        POSTACTION(m);
        if (newp == oldp) {
          check_inuse_chunk(m, newp);
          mem = oldmem;
        }
      }
    }
  }
  return mem;
}